

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  uint offset;
  Descriptor *this_00;
  TypeInfo *pTVar1;
  DynamicMessage *pDVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  CppType CVar7;
  InternalMetadataWithArena *this_01;
  ExtensionSet *this_02;
  FieldDescriptor *this_03;
  OneofDescriptor *pOVar8;
  char *pcVar9;
  int *piVar10;
  uint *puVar11;
  ArenaStringPtr *pAVar12;
  FieldOptions *pFVar13;
  string *psVar14;
  RepeatedField<double> *this_04;
  int __c;
  int __c_00;
  Message *message;
  string *default_value_1;
  void *field_ptr;
  string *default_value;
  void *field_ptr_1;
  FieldDescriptor *field;
  int i;
  Descriptor *descriptor;
  DynamicMessage *this_local;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_00d61a20;
  this_00 = this->type_info_->type;
  this_01 = (InternalMetadataWithArena *)
            OffsetToPointer(this,this->type_info_->internal_metadata_offset);
  internal::InternalMetadataWithArena::~InternalMetadataWithArena(this_01);
  if (this->type_info_->extensions_offset != -1) {
    this_02 = (ExtensionSet *)OffsetToPointer(this,this->type_info_->extensions_offset);
    internal::ExtensionSet::~ExtensionSet(this_02);
  }
  for (field._4_4_ = 0; iVar5 = Descriptor::field_count(this_00), (int)field._4_4_ < iVar5;
      field._4_4_ = field._4_4_ + 1) {
    pcVar9 = (char *)(ulong)field._4_4_;
    this_03 = Descriptor::field(this_00,field._4_4_);
    pOVar8 = FieldDescriptor::containing_oneof(this_03);
    if (pOVar8 == (OneofDescriptor *)0x0) {
      puVar11 = internal::scoped_array<unsigned_int>::operator[]
                          (&this->type_info_->offsets,(long)(int)field._4_4_);
      this_04 = (RepeatedField<double> *)OffsetToPointer(this,*puVar11);
      bVar4 = FieldDescriptor::is_repeated(this_03);
      if (bVar4) {
        CVar7 = FieldDescriptor::cpp_type(this_03);
        switch(CVar7) {
        case CPPTYPE_INT32:
          RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_04);
          break;
        case CPPTYPE_INT64:
          RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_04);
          break;
        case CPPTYPE_UINT32:
          RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_04);
          break;
        case CPPTYPE_UINT64:
          RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_04);
          break;
        case CPPTYPE_DOUBLE:
          RepeatedField<double>::~RepeatedField(this_04);
          break;
        case CPPTYPE_FLOAT:
          RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_04);
          break;
        case CPPTYPE_BOOL:
          RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_04);
          break;
        case CPPTYPE_ENUM:
          RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_04);
          break;
        case CPPTYPE_STRING:
          pFVar13 = FieldDescriptor::options(this_03);
          FieldOptions::ctype(pFVar13);
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)this_04);
          break;
        case CPPTYPE_MESSAGE:
          bVar4 = anon_unknown_0::IsMapFieldInApi(this_03);
          if (bVar4) {
            (*(code *)**(undefined8 **)this_04)();
          }
          else {
            RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)this_04);
          }
        }
      }
      else {
        CVar7 = FieldDescriptor::cpp_type(this_03);
        if (CVar7 == CPPTYPE_STRING) {
          pFVar13 = FieldDescriptor::options(this_03);
          FieldOptions::ctype(pFVar13);
          pDVar2 = this->type_info_->prototype;
          puVar11 = internal::scoped_array<unsigned_int>::operator[]
                              (&this->type_info_->offsets,(long)(int)field._4_4_);
          pAVar12 = (ArenaStringPtr *)OffsetToPointer(pDVar2,*puVar11);
          psVar14 = internal::ArenaStringPtr::Get_abi_cxx11_(pAVar12);
          internal::ArenaStringPtr::Destroy((ArenaStringPtr *)this_04,psVar14,(Arena *)0x0);
        }
        else {
          CVar7 = FieldDescriptor::cpp_type(this_03);
          if ((((CVar7 == CPPTYPE_MESSAGE) && (bVar4 = is_prototype(this), !bVar4)) &&
              (plVar3 = *(long **)this_04, plVar3 != (long *)0x0)) && (plVar3 != (long *)0x0)) {
            (**(code **)(*plVar3 + 8))();
          }
        }
      }
    }
    else {
      iVar5 = this->type_info_->oneof_case_offset;
      pOVar8 = FieldDescriptor::containing_oneof(this_03);
      pcVar9 = OneofDescriptor::index(pOVar8,pcVar9,__c);
      offset = iVar5 + (int)pcVar9 * 4;
      pcVar9 = (char *)(ulong)offset;
      piVar10 = (int *)OffsetToPointer(this,offset);
      iVar5 = *piVar10;
      iVar6 = FieldDescriptor::number(this_03);
      if (iVar5 == iVar6) {
        pTVar1 = this->type_info_;
        iVar5 = Descriptor::field_count(this_00);
        pOVar8 = FieldDescriptor::containing_oneof(this_03);
        pcVar9 = OneofDescriptor::index(pOVar8,pcVar9,__c_00);
        puVar11 = internal::scoped_array<unsigned_int>::operator[]
                            (&pTVar1->offsets,(long)(iVar5 + (int)pcVar9));
        pAVar12 = (ArenaStringPtr *)OffsetToPointer(this,*puVar11);
        CVar7 = FieldDescriptor::cpp_type(this_03);
        if (CVar7 == CPPTYPE_STRING) {
          pFVar13 = FieldDescriptor::options(this_03);
          FieldOptions::ctype(pFVar13);
          pDVar2 = this->type_info_->prototype;
          puVar11 = internal::scoped_array<unsigned_int>::operator[]
                              (&this->type_info_->offsets,(long)(int)field._4_4_);
          psVar14 = internal::ArenaStringPtr::Get_abi_cxx11_
                              ((ArenaStringPtr *)
                               ((long)&(pDVar2->super_Message).super_MessageLite._vptr_MessageLite +
                               (ulong)*puVar11));
          internal::ArenaStringPtr::Destroy(pAVar12,psVar14,(Arena *)0x0);
        }
        else {
          CVar7 = FieldDescriptor::cpp_type(this_03);
          if ((CVar7 == CPPTYPE_MESSAGE) && (pAVar12->ptr_ != (string *)0x0)) {
            (**(code **)(*(long *)pAVar12->ptr_ + 8))();
          }
        }
      }
    }
  }
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  reinterpret_cast<InternalMetadataWithArena*>(
      OffsetToPointer(type_info_->internal_metadata_offset))
      ->~InternalMetadataWithArena();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
      OffsetToPointer(type_info_->extensions_offset))->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->containing_oneof()) {
      void* field_ptr = OffsetToPointer(
          type_info_->oneof_case_offset
          + sizeof(uint32) * field->containing_oneof()->index());
      if (*(reinterpret_cast<const uint32*>(field_ptr)) ==
          field->number()) {
        field_ptr = OffsetToPointer(type_info_->offsets[
            descriptor->field_count() + field->containing_oneof()->index()]);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING: {
              const ::std::string* default_value =
                  &(reinterpret_cast<const ArenaStringPtr*>(
                        reinterpret_cast<const uint8*>(
                            type_info_->prototype) +
                        type_info_->offsets[i])
                        ->Get());
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
                  default_value, NULL);
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
        case FieldDescriptor::CPPTYPE_##UPPERCASE :                           \
          reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr)              \
              ->~RepeatedField<LOWERCASE>();                                  \
          break

        HANDLE_TYPE( INT32,  int32);
        HANDLE_TYPE( INT64,  int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE( FLOAT,  float);
        HANDLE_TYPE(  BOOL,   bool);
        HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<string>*>(field_ptr)
                  ->~RepeatedPtrField<string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          const ::std::string* default_value =
              &(reinterpret_cast<const ArenaStringPtr*>(
                    type_info_->prototype->OffsetToPointer(
                        type_info_->offsets[i]))
                    ->Get());
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
              default_value, NULL);
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}